

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalNinjaGenerator::FindMakeProgram(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  bool bVar1;
  char *pcVar2;
  string version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string local_c8;
  string error;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = cmGlobalGenerator::FindMakeProgram((cmGlobalGenerator *)this,mf);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&error);
    pcVar2 = cmMakefile::GetDefinition(mf,&version);
    std::__cxx11::string::~string((string *)&version);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->NinjaCommand);
      command.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      command.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      command.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&command,&this->NinjaCommand);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[10]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
                 (char (*) [10])"--version");
      version._M_dataplus._M_p = (pointer)&version.field_2;
      version._M_string_length = 0;
      version.field_2._M_local_buf[0] = '\0';
      error._M_dataplus._M_p = (pointer)&error.field_2;
      error._M_string_length = 0;
      error.field_2._M_local_buf[0] = '\0';
      bVar1 = cmSystemTools::RunSingleCommand
                        (&command,&version,&error,(int *)0x0,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0
                         ,Auto);
      if (bVar1) {
        cmSystemTools::TrimWhitespace(&local_c8,&version);
        std::__cxx11::string::operator=((string *)&this->NinjaVersion,(string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        CheckNinjaFeatures(this);
      }
      else {
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_88,&command,"\' \'");
        std::operator+(&local_68,"Running\n \'",&local_88);
        std::operator+(&local_48,&local_68,"\'\nfailed with:\n ");
        std::operator+(&local_c8,&local_48,&error);
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        cmSystemTools::s_FatalErrorOccured = true;
      }
      std::__cxx11::string::~string((string *)&error);
      std::__cxx11::string::~string((string *)&version);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&command);
      if (!bVar1) goto LAB_0024237f;
    }
    bVar1 = true;
  }
  else {
LAB_0024237f:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmGlobalNinjaGenerator::FindMakeProgram(cmMakefile* mf)
{
  if (!this->cmGlobalGenerator::FindMakeProgram(mf)) {
    return false;
  }
  if (const char* ninjaCommand = mf->GetDefinition("CMAKE_MAKE_PROGRAM")) {
    this->NinjaCommand = ninjaCommand;
    std::vector<std::string> command;
    command.push_back(this->NinjaCommand);
    command.emplace_back("--version");
    std::string version;
    std::string error;
    if (!cmSystemTools::RunSingleCommand(command, &version, &error, nullptr,
                                         nullptr,
                                         cmSystemTools::OUTPUT_NONE)) {
      mf->IssueMessage(MessageType::FATAL_ERROR,
                       "Running\n '" + cmJoin(command, "' '") +
                         "'\n"
                         "failed with:\n " +
                         error);
      cmSystemTools::SetFatalErrorOccured();
      return false;
    }
    this->NinjaVersion = cmSystemTools::TrimWhitespace(version);
    this->CheckNinjaFeatures();
  }
  return true;
}